

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media_test.cpp
# Opt level: O2

void __thiscall HenyeyGreenstein_g_Test::TestBody(HenyeyGreenstein_g_Test *this)

{
  undefined1 auVar1 [16];
  char *message;
  float fVar2;
  float fVar3;
  undefined1 extraout_var_00 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  float fVar9;
  float fVar10;
  Vector3f VVar11;
  char *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  float local_d8;
  float fStack_d4;
  float in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  double val2;
  undefined4 in_stack_ffffffffffffff44;
  HGPhaseFunction hg;
  AssertionResult gtest_ar;
  Point2f u;
  Stratified2DIter __begin2;
  Stratified2DIter __end2;
  RNG rng;
  undefined1 extraout_var [60];
  undefined1 auVar8 [56];
  undefined1 extraout_var_01 [56];
  
  rng.state = 0x853c49e6748fea9b;
  rng.inc = 0xda3e39cb94b95bdb;
  for (fVar2 = -0.75; fVar2 <= 0.75; fVar2 = fVar2 + 0.25) {
    hg.g = fVar2;
    fVar3 = pbrt::RNG::Uniform<float>(&rng);
    gtest_ar._4_4_ = pbrt::RNG::Uniform<float>(&rng);
    auVar8 = extraout_var_00;
    gtest_ar._0_4_ = fVar3;
    VVar11 = pbrt::SampleUniformSphere((Point2f *)&gtest_ar);
    fVar9 = VVar11.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar4._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar4._8_56_ = auVar8;
    gtest_ar.success_ = false;
    gtest_ar._1_3_ = 0x10;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    val2 = (double)vmovlps_avx(auVar4._0_16_);
    pbrt::detail::IndexingGenerator<pbrt::Stratified2D,_pbrt::detail::Stratified2DIter>::begin
              (&__begin2,
               (IndexingGenerator<pbrt::Stratified2D,_pbrt::detail::Stratified2DIter> *)&gtest_ar);
    pbrt::detail::IndexingGenerator<pbrt::Stratified2D,_pbrt::detail::Stratified2DIter>::end
              (&__end2,(IndexingGenerator<pbrt::Stratified2D,_pbrt::detail::Stratified2DIter> *)
                       &gtest_ar);
    fVar10 = 0.0;
    while (__begin2.super_RNGIterator<pbrt::detail::Stratified2DIter>.
           super_IndexingIterator<pbrt::detail::Stratified2DIter>.i !=
           __end2.super_RNGIterator<pbrt::detail::Stratified2DIter>.
           super_IndexingIterator<pbrt::detail::Stratified2DIter>.i) {
      auVar5._0_8_ = pbrt::detail::Stratified2DIter::operator*(&__begin2);
      auVar5._8_56_ = extraout_var_01;
      u.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar5._0_16_);
      auVar8 = extraout_var_01;
      VVar11 = pbrt::SampleUniformSphere(&u);
      in_stack_ffffffffffffff30 = VVar11.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar6._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar6._8_56_ = auVar8;
      _local_d8 = vmovlps_avx(auVar6._0_16_);
      auVar7._0_4_ = pbrt::HGPhaseFunction::p
                               (&hg,(Vector3f *)&stack0xffffffffffffff38,(Vector3f *)&local_d8);
      auVar7._4_60_ = extraout_var;
      auVar1 = vfmadd231ss_fma(ZEXT416((uint)((float)((ulong)val2 >> 0x20) * fStack_d4)),
                               ZEXT416((uint)SUB84(val2,0)),ZEXT416((uint)local_d8));
      __begin2.super_RNGIterator<pbrt::detail::Stratified2DIter>.
      super_IndexingIterator<pbrt::detail::Stratified2DIter>.i =
           __begin2.super_RNGIterator<pbrt::detail::Stratified2DIter>.
           super_IndexingIterator<pbrt::detail::Stratified2DIter>.i + 1;
      auVar1 = vfmadd132ss_fma(ZEXT416((uint)fVar9),auVar1,ZEXT416((uint)in_stack_ffffffffffffff30))
      ;
      auVar1 = vfnmadd231ss_fma(ZEXT416((uint)fVar10),auVar7._0_16_,auVar1);
      fVar10 = auVar1._0_4_;
      fVar3 = fVar10;
    }
    testing::internal::DoubleNearPredFormat
              ((char *)CONCAT44(fVar3,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18,
               (char *)0x319e51,(double)CONCAT44(in_stack_ffffffffffffff44,fVar9),val2,
               (double)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&__begin2);
      message = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&__end2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/media_test.cpp"
                 ,0x60,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&__end2,(Message *)&__begin2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__end2);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&__begin2);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  return;
}

Assistant:

TEST(HenyeyGreenstein, g) {
    RNG rng;
    for (float g = -.75; g <= 0.75; g += 0.25) {
        HGPhaseFunction hg(g);
        Vector3f wo = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
        Float sum = 0;
        int sqrtSamples = 64;
        int nSamples = sqrtSamples * sqrtSamples;
        for (Point2f u : Stratified2D(sqrtSamples, sqrtSamples)) {
            Vector3f wi = SampleUniformSphere(u);
            // Negate dot to match direction convention
            sum += hg.p(wo, wi) * -Dot(wo, wi);
        }
        Float gEst = sum / (nSamples * UniformSpherePDF());
        EXPECT_NEAR(g, gEst, .01);
    }
}